

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concave_hull.cpp
# Opt level: O1

void empty_invoker(void)

{
  undefined8 uVar1;
  empty t;
  char local_2a8;
  undefined7 uStack_2a7;
  undefined1 local_298 [16];
  empty local_288;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ostringstream local_218 [376];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_220 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_2a8 = '\"';
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,&local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"empty",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_a0);
  if ((undefined1 *)CONCAT71(uStack_2a7,local_2a8) != local_298) {
    operator_delete((undefined1 *)CONCAT71(uStack_2a7,local_2a8));
  }
  local_40 = local_a0;
  local_38 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x22);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_288.super_ConcaveHull.input.
  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  .
  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super_ConcaveHull.input.
  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  .
  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.super_ConcaveHull.input.
  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  .
  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_230 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_2a8 = '\"';
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,&local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"empty",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_a0);
  if ((undefined1 *)CONCAT71(uStack_2a7,local_2a8) != local_298) {
    operator_delete((undefined1 *)CONCAT71(uStack_2a7,local_2a8));
  }
  local_50 = local_a0;
  local_48 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x22);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_240 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_2a8 = '\"';
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,&local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"empty",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_a0);
  if ((undefined1 *)CONCAT71(uStack_2a7,local_2a8) != local_298) {
    operator_delete((undefined1 *)CONCAT71(uStack_2a7,local_2a8));
  }
  local_60 = local_a0;
  local_58 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x22);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  empty::test_method(&local_288);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_250 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_2a8 = '\"';
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,&local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"empty",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_a0);
  if ((undefined1 *)CONCAT71(uStack_2a7,local_2a8) != local_298) {
    operator_delete((undefined1 *)CONCAT71(uStack_2a7,local_2a8));
  }
  local_70 = local_a0;
  local_68 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x22);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_260 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_2a8 = '\"';
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,&local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"empty",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_a0);
  if ((undefined1 *)CONCAT71(uStack_2a7,local_2a8) != local_298) {
    operator_delete((undefined1 *)CONCAT71(uStack_2a7,local_2a8));
  }
  local_80 = local_a0;
  local_78 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x22);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  if (local_288.super_ConcaveHull.input.
      super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
      .
      super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.super_ConcaveHull.input.
                    super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
                    .
                    super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(empty, ConcaveHull)
{
    Ring hull = list_of(Point(0, 0))(Point(0, 1))(Point(1, 1))(Point(1, 0)), hull_copy(hull);
    concave_hull(input, 0, hull);
    BOOST_CHECK(equals(hull, hull_copy));
}